

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> * __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::Clone
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this_00;
  
  this_00 = (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *)operator_new(0x98);
  chrono::ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  *(undefined8 *)&this_00->field_0x38 = *(undefined8 *)&this->field_0x38;
  *(undefined ***)this_00 = &PTR__ChLoad_00138d50;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoader_00138be0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader.Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader.Q);
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_00138ba0;
  p_Var2 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
           super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var1 = (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
           super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
       super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.loadable.
  super___shared_ptr<chrono::ChLoadableU,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this_00->loader).super_ChLoaderUdistributed.super_ChLoaderU.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderU_00138e08;
  dVar3 = (this->loader).torqueperunit.m_data[1];
  dVar4 = (this->loader).torqueperunit.m_data[2];
  dVar5 = (this->loader).forceperunit.m_data[0];
  (this_00->loader).torqueperunit.m_data[0] = (this->loader).torqueperunit.m_data[0];
  (this_00->loader).torqueperunit.m_data[1] = dVar3;
  (this_00->loader).torqueperunit.m_data[2] = dVar4;
  (this_00->loader).forceperunit.m_data[0] = dVar5;
  dVar3 = (this->loader).forceperunit.m_data[2];
  (this_00->loader).forceperunit.m_data[1] = (this->loader).forceperunit.m_data[1];
  (this_00->loader).forceperunit.m_data[2] = dVar3;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }